

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

int FinishRow(void *arg1,void *arg2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  size_t __n;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint8_t *puVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint8_t *puVar24;
  long lVar25;
  int iVar26;
  uint8_t *puVar27;
  size_t __n_00;
  long lVar28;
  long lVar29;
  
  iVar4 = *(int *)((long)arg1 + 0xd8);
  bVar1 = ""[*(int *)((long)arg1 + 0xb68)];
  uVar15 = (uint)bVar1;
  iVar16 = *(int *)((long)arg1 + 0xb40);
  iVar26 = *(int *)((long)arg1 + 0xb44);
  lVar12 = *(long *)((long)arg1 + 0xb28);
  lVar23 = *(long *)((long)arg1 + 0xb30);
  lVar19 = *(long *)((long)arg1 + 0xb38);
  iVar5 = *(int *)((long)arg1 + 0xdc);
  iVar6 = *(int *)((long)arg1 + 0x1ac);
  if (*(int *)((long)arg1 + 200) == 2) {
    ReconstructRow((VP8Decoder *)arg1,(VP8ThreadContext *)((long)arg1 + 0xd8));
  }
  __n_00 = (ulong)uVar15 * (long)iVar16;
  __n = (size_t)(int)((uint)(bVar1 >> 1) * iVar26);
  if ((*(int *)((long)arg1 + 0xe0) != 0) &&
     (lVar21 = (long)*(int *)((long)arg1 + 0x1a0),
     *(int *)((long)arg1 + 0x1a0) < *(int *)((long)arg1 + 0x1a8))) {
    iVar11 = *(int *)((long)arg1 + 0xdc);
    lVar17 = lVar21 * 8;
    lVar28 = lVar21 << 4;
    do {
      lVar25 = *(long *)((long)arg1 + 0xe8);
      bVar1 = *(byte *)(lVar25 + lVar21 * 4);
      if (bVar1 != 0) {
        iVar14 = *(int *)((long)arg1 + 0xb40);
        puVar27 = (uint8_t *)
                  ((long)(*(int *)((long)arg1 + 0xd8) * iVar14 * 0x10) +
                   *(long *)((long)arg1 + 0xb28) + lVar28);
        if (*(int *)((long)arg1 + 0xb68) == 1) {
          if (0 < lVar21) {
            (*VP8SimpleHFilter16)(puVar27,iVar14,bVar1 + 4);
          }
          if (*(char *)(lVar25 + 2 + lVar21 * 4) != '\0') {
            (*VP8SimpleHFilter16i)(puVar27,iVar14,(uint)bVar1);
          }
          if (0 < iVar11) {
            (*VP8SimpleVFilter16)(puVar27,iVar14,bVar1 + 4);
          }
          if (*(char *)(lVar25 + 2 + lVar21 * 4) != '\0') {
            (*VP8SimpleVFilter16i)(puVar27,iVar14,(uint)bVar1);
          }
        }
        else {
          bVar2 = *(byte *)(lVar25 + 1 + lVar21 * 4);
          iVar7 = *(int *)((long)arg1 + 0xb44);
          lVar22 = (long)(*(int *)((long)arg1 + 0xd8) * iVar7 * 8);
          puVar24 = (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar22 + lVar17);
          puVar18 = (uint8_t *)(lVar22 + *(long *)((long)arg1 + 0xb38) + lVar17);
          bVar3 = *(byte *)(lVar25 + 3 + lVar21 * 4);
          uVar13 = (uint)bVar2;
          if (0 < lVar21) {
            (*VP8HFilter16)(puVar27,iVar14,bVar1 + 4,uVar13,(uint)bVar3);
            (*VP8HFilter8)(puVar24,puVar18,iVar7,bVar1 + 4,uVar13,(uint)bVar3);
          }
          uVar20 = (uint)bVar3;
          if (*(char *)(lVar25 + 2 + lVar21 * 4) != '\0') {
            (*VP8HFilter16i)(puVar27,iVar14,(uint)bVar1,uVar13,uVar20);
            (*VP8HFilter8i)(puVar24,puVar18,iVar7,(uint)bVar1,uVar13,uVar20);
          }
          if (0 < iVar11) {
            (*VP8VFilter16)(puVar27,iVar14,bVar1 + 4,uVar13,uVar20);
            (*VP8VFilter8)(puVar24,puVar18,iVar7,bVar1 + 4,uVar13,uVar20);
          }
          if (*(char *)(lVar25 + 2 + lVar21 * 4) != '\0') {
            (*VP8VFilter16i)(puVar27,iVar14,(uint)bVar1,(uint)bVar2,uVar20);
            (*VP8VFilter8i)(puVar24,puVar18,iVar7,(uint)bVar1,(uint)bVar2,uVar20);
          }
        }
      }
      lVar21 = lVar21 + 1;
      lVar17 = lVar17 + 8;
      lVar28 = lVar28 + 0x10;
    } while (lVar21 < *(int *)((long)arg1 + 0x1a8));
  }
  lVar21 = (long)iVar4 * (long)iVar16 * 0x10;
  lVar17 = (long)(iVar26 * iVar4 * 8);
  if ((*(int *)((long)arg1 + 0x338) != 0) &&
     (lVar28 = (long)*(int *)((long)arg1 + 0x1a0),
     *(int *)((long)arg1 + 0x1a0) < *(int *)((long)arg1 + 0x1a8))) {
    lVar25 = lVar28 * 8;
    lVar22 = lVar28 * 100;
    do {
      lVar8 = *(long *)((long)arg1 + 0xf0);
      uVar13 = (uint)*(byte *)(lVar8 + 0x31c + lVar22 * 8);
      if (3 < uVar13) {
        iVar16 = *(int *)((long)arg1 + 0xb44);
        lVar29 = (long)(*(int *)((long)arg1 + 0xd8) * iVar16 * 8);
        lVar9 = *(long *)((long)arg1 + 0xb38);
        Dither8x8((VP8Random *)((long)arg1 + 0x33c),
                  (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar29 + lVar25),iVar16,uVar13);
        Dither8x8((VP8Random *)((long)arg1 + 0x33c),(uint8_t *)(lVar29 + lVar9 + lVar25),iVar16,
                  (uint)*(byte *)(lVar8 + 0x31c + lVar22 * 8));
      }
      lVar28 = lVar28 + 1;
      lVar25 = lVar25 + 8;
      lVar22 = lVar22 + 100;
    } while (lVar28 < *(int *)((long)arg1 + 0x1a8));
  }
  lVar12 = (lVar12 - __n_00) + lVar21;
  lVar28 = (lVar23 - __n) + lVar17;
  lVar23 = (lVar19 - __n) + lVar17;
  iVar6 = iVar6 + -1;
  if (*(long *)((long)arg2 + 0x40) == 0) {
    iVar16 = 1;
    goto LAB_0011eb01;
  }
  iVar26 = iVar5 * 0x10;
  iVar16 = iVar26 + 0x10;
  if (iVar5 == 0) {
    *(long *)((long)arg2 + 0x18) = lVar21 + *(long *)((long)arg1 + 0xb28);
    *(long *)((long)arg2 + 0x20) = *(long *)((long)arg1 + 0xb30) + lVar17;
    lVar17 = lVar17 + *(long *)((long)arg1 + 0xb38);
  }
  else {
    iVar26 = iVar26 - uVar15;
    *(long *)((long)arg2 + 0x18) = lVar12;
    *(long *)((long)arg2 + 0x20) = lVar28;
    lVar17 = lVar23;
  }
  *(long *)((long)arg2 + 0x28) = lVar17;
  if (iVar6 <= iVar5) {
    uVar15 = 0;
  }
  iVar16 = iVar16 - uVar15;
  if (*(int *)((long)arg2 + 0x84) <= iVar16) {
    iVar16 = *(int *)((long)arg2 + 0x84);
  }
  *(undefined8 *)((long)arg2 + 0x98) = 0;
  if ((*(long *)((long)arg1 + 0xb98) == 0) || (iVar16 - iVar26 == 0 || iVar16 < iVar26)) {
LAB_0011ea17:
    iVar11 = *(int *)((long)arg2 + 0x80);
    iVar14 = iVar11 - iVar26;
    if (iVar14 != 0 && iVar26 <= iVar11) {
      *(long *)((long)arg2 + 0x18) =
           *(long *)((long)arg2 + 0x18) + (long)*(int *)((long)arg1 + 0xb40) * (long)iVar14;
      lVar19 = (long)(iVar14 >> 1) * (long)*(int *)((long)arg1 + 0xb44);
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + lVar19;
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + lVar19;
      iVar26 = iVar11;
      if (*(long *)((long)arg2 + 0x98) != 0) {
        *(long *)((long)arg2 + 0x98) = *(long *)((long)arg2 + 0x98) + (long)*arg2 * (long)iVar14;
      }
    }
    bVar10 = true;
    if (iVar16 - iVar26 == 0 || iVar16 < iVar26) {
      iVar16 = 1;
    }
    else {
      iVar14 = *(int *)((long)arg2 + 0x78);
      *(long *)((long)arg2 + 0x18) = *(long *)((long)arg2 + 0x18) + (long)iVar14;
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + (long)(iVar14 >> 1);
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + (long)(iVar14 >> 1);
      if (*(long *)((long)arg2 + 0x98) != 0) {
        *(long *)((long)arg2 + 0x98) = *(long *)((long)arg2 + 0x98) + (long)iVar14;
      }
      *(int *)((long)arg2 + 8) = iVar26 - iVar11;
      *(int *)((long)arg2 + 0xc) = *(int *)((long)arg2 + 0x7c) - iVar14;
      *(int *)((long)arg2 + 0x10) = iVar16 - iVar26;
      iVar11 = (**(code **)((long)arg2 + 0x40))();
      iVar16 = iVar11;
    }
  }
  else {
    puVar27 = VP8DecompressAlphaRows((VP8Decoder *)arg1,(VP8Io *)arg2,iVar26,iVar16 - iVar26);
    *(uint8_t **)((long)arg2 + 0x98) = puVar27;
    if (puVar27 != (uint8_t *)0x0) goto LAB_0011ea17;
    iVar11 = VP8SetError((VP8Decoder *)arg1,VP8_STATUS_BITSTREAM_ERROR,
                         "Could not decode alpha data.");
    iVar16 = 1;
    bVar10 = false;
  }
  if (!bVar10) {
    return iVar11;
  }
LAB_0011eb01:
  if (iVar4 + 1 == *(int *)((long)arg1 + 0xd0) && iVar5 < iVar6) {
    memcpy((void *)(*(long *)((long)arg1 + 0xb28) - __n_00),
           (void *)(lVar12 + (long)*(int *)((long)arg1 + 0xb40) * 0x10),__n_00);
    memcpy((void *)(*(long *)((long)arg1 + 0xb30) + -__n),
           (void *)((long)*(int *)((long)arg1 + 0xb44) * 8 + lVar28),__n);
    memcpy((void *)(-__n + *(long *)((long)arg1 + 0xb38)),
           (void *)(lVar23 + (long)*(int *)((long)arg1 + 0xb44) * 8),__n);
  }
  return iVar16;
}

Assistant:

static int FinishRow(void* arg1, void* arg2) {
  VP8Decoder* const dec = (VP8Decoder*)arg1;
  VP8Io* const io = (VP8Io*)arg2;
  int ok = 1;
  const VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int cache_id = ctx->id_;
  const int extra_y_rows = kFilterExtraRows[dec->filter_type_];
  const int ysize = extra_y_rows * dec->cache_y_stride_;
  const int uvsize = (extra_y_rows / 2) * dec->cache_uv_stride_;
  const int y_offset = cache_id * 16 * dec->cache_y_stride_;
  const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
  uint8_t* const ydst = dec->cache_y_ - ysize + y_offset;
  uint8_t* const udst = dec->cache_u_ - uvsize + uv_offset;
  uint8_t* const vdst = dec->cache_v_ - uvsize + uv_offset;
  const int mb_y = ctx->mb_y_;
  const int is_first_row = (mb_y == 0);
  const int is_last_row = (mb_y >= dec->br_mb_y_ - 1);

  if (dec->mt_method_ == 2) {
    ReconstructRow(dec, ctx);
  }

  if (ctx->filter_row_) {
    FilterRow(dec);
  }

  if (dec->dither_) {
    DitherRow(dec);
  }

  if (io->put != NULL) {
    int y_start = MACROBLOCK_VPOS(mb_y);
    int y_end = MACROBLOCK_VPOS(mb_y + 1);
    if (!is_first_row) {
      y_start -= extra_y_rows;
      io->y = ydst;
      io->u = udst;
      io->v = vdst;
    } else {
      io->y = dec->cache_y_ + y_offset;
      io->u = dec->cache_u_ + uv_offset;
      io->v = dec->cache_v_ + uv_offset;
    }

    if (!is_last_row) {
      y_end -= extra_y_rows;
    }
    if (y_end > io->crop_bottom) {
      y_end = io->crop_bottom;    // make sure we don't overflow on last row.
    }
    // If dec->alpha_data_ is not NULL, we have some alpha plane present.
    io->a = NULL;
    if (dec->alpha_data_ != NULL && y_start < y_end) {
      io->a = VP8DecompressAlphaRows(dec, io, y_start, y_end - y_start);
      if (io->a == NULL) {
        return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                           "Could not decode alpha data.");
      }
    }
    if (y_start < io->crop_top) {
      const int delta_y = io->crop_top - y_start;
      y_start = io->crop_top;
      assert(!(delta_y & 1));
      io->y += dec->cache_y_stride_ * delta_y;
      io->u += dec->cache_uv_stride_ * (delta_y >> 1);
      io->v += dec->cache_uv_stride_ * (delta_y >> 1);
      if (io->a != NULL) {
        io->a += io->width * delta_y;
      }
    }
    if (y_start < y_end) {
      io->y += io->crop_left;
      io->u += io->crop_left >> 1;
      io->v += io->crop_left >> 1;
      if (io->a != NULL) {
        io->a += io->crop_left;
      }
      io->mb_y = y_start - io->crop_top;
      io->mb_w = io->crop_right - io->crop_left;
      io->mb_h = y_end - y_start;
      ok = io->put(io);
    }
  }
  // rotate top samples if needed
  if (cache_id + 1 == dec->num_caches_) {
    if (!is_last_row) {
      memcpy(dec->cache_y_ - ysize, ydst + 16 * dec->cache_y_stride_, ysize);
      memcpy(dec->cache_u_ - uvsize, udst + 8 * dec->cache_uv_stride_, uvsize);
      memcpy(dec->cache_v_ - uvsize, vdst + 8 * dec->cache_uv_stride_, uvsize);
    }
  }

  return ok;
}